

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

Layer * ncnn::Convolution_x86_layer_creator(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x308);
  Convolution::Convolution((Convolution *)(puVar1 + 0x20));
  *puVar1 = 0x18bc60;
  puVar1[0x20] = 0x18bce0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  puVar1[0x18] = 0;
  puVar1[0x19] = 0;
  *(undefined8 *)((long)puVar1 + 0xcc) = 0;
  *(undefined8 *)((long)puVar1 + 0xd4) = 0;
  puVar1[0x1c] = 0;
  puVar1[0x1d] = 0;
  puVar1[0x1e] = 0;
  puVar1[0x1f] = 0;
  puVar1[1] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  *(undefined8 *)((long)puVar1 + 100) = 0;
  *(undefined8 *)((long)puVar1 + 0x6c) = 0;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0;
  puVar1[0x16] = 0;
  return &((Convolution *)(puVar1 + 0x20))->super_Layer;
}

Assistant:

Convolution_x86::Convolution_x86()
{
    activation = 0;
    convolution_dilation1 = 0;
}